

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_generator.hpp
# Opt level: O2

node_pointer __thiscall
ranger::bhvr_tree::
xml_generator<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>,_true_node,_false_node>
::generate_node_by_data
          (xml_generator<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>,_true_node,_false_node>
           *this,xml_node<char> *data)

{
  xml_node<char> *pxVar1;
  xml_attribute<char> *pxVar2;
  ostream *poVar3;
  xml_node<char> *in_RDX;
  xml_node<char> *data_00;
  
  pxVar2 = rapidxml::xml_node<char>::first_attribute(in_RDX,"class",0,true);
  if (pxVar2 == (xml_attribute<char> *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "bhvr_tree_error: cannot find class name attribute");
    std::endl<char,std::char_traits<char>>(poVar3);
    (this->super_template_extend<true_node,_false_node>).super_generator_interface<_86869e04_>.
    super_generator_unit<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>,_rapidxml::xml_node<char>_*,_ranger::bhvr_tree::selector_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>
    ._vptr_generator_unit = (_func_int **)0x0;
  }
  else {
    pxVar1 = (xml_node<char> *)(pxVar2->super_xml_base<char>).m_value;
    data_00 = (xml_node<char> *)&rapidxml::xml_base<char>::nullstr()::zero;
    if (pxVar1 != (xml_node<char> *)0x0) {
      data_00 = pxVar1;
    }
    abstract_generator<$86869e04$>::generate_node_by_name
              (&this->super_template_extend<true_node,_false_node>,(char *)data,data_00);
  }
  return (__uniq_ptr_data<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>,_true,_true>
          )(__uniq_ptr_data<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>,_true,_true>
            )this;
}

Assistant:

node_pointer generate_node_by_data(rapidxml::xml_node<>* data) const {
    auto name = data->first_attribute("class");
    if (!name) {
      std::cerr << "bhvr_tree_error: cannot find class name attribute" << std::endl;
      return node_pointer();
    }

    return this->generate_node_by_name(name->value(), data);
  }